

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::CTcCodeStream(CTcCodeStream *this,char stream_id)

{
  undefined1 in_SIL;
  undefined8 *in_RDI;
  CTcDataStream *unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  CTcDataStream::CTcDataStream(unaff_retaddr,(char)((ulong)in_RDI >> 0x38));
  *in_RDI = &PTR__CTcCodeStream_003cfc80;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[1] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x16] = 0;
  alloc_line_pages((CTcCodeStream *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
  in_RDI[0x18] = 0;
  in_RDI[0x1d] = 0;
  return;
}

Assistant:

CTcCodeStream::CTcCodeStream(char stream_id)
    : CTcDataStream(stream_id)
{
    /* no switch yet */
    cur_switch_ = 0;

    /* no enclosing statement yet */
    enclosing_ = 0;

    /* no code body being generated yet */
    code_body_ = 0;

    /* start writing at offset zero */
    ofs_ = 0;

    /* no symbol tables yet */
    symtab_ = 0;
    goto_symtab_ = 0;

    /* no labels yet */
    active_lbl_ = 0;
    free_lbl_ = 0;

    /* no fixups yet */
    free_fixup_ = 0;

    /* allocate an initial set of line record pages */
    line_pages_alloc_ = 0;
    line_pages_ = 0;
    alloc_line_pages(5);

    /* no line records in use yet */
    line_cnt_ = 0;

    /* no local frame yet */
    cur_frame_ = 0;
}